

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptBlock.cpp
# Opt level: O2

Object * __thiscall ScriptBlock::execute(ScriptBlock *this,Engine *engine)

{
  LocalFunction *this_00;
  uint localFunctionName;
  ulong uVar1;
  
  if (this->isRoot == true) {
    for (uVar1 = 0; uVar1 < this->functionsCount; uVar1 = uVar1 + 1) {
      this_00 = this->functions[uVar1];
      localFunctionName = LocalFunction::getName(this_00);
      Engine::setLocalFunction(engine,localFunctionName,this_00);
    }
  }
  for (uVar1 = 0; uVar1 < this->commandsCount; uVar1 = uVar1 + 1) {
    executeVoid(this->commands[uVar1],engine);
  }
  return (Object *)0x0;
}

Assistant:

Object *ScriptBlock::execute(Engine *engine) {
	unsigned int i;
	if (this->isRoot) {
		for (i = 0; i < this->functionsCount; i++) {
			LocalFunction* function = this->functions[i];
			engine->setLocalFunction(function->getName(), function);
		}
	}
	
	for (i = 0; i < this->commandsCount; i++) {
		executeVoid(this->commands[i], engine);
	}
	return nullptr;
}